

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::FinishControlTask::checkArguments
          (FinishControlTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  size_type sVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *in_R8;
  ASTContext *unaff_retaddr;
  SystemSubroutine *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  size_t in_stack_00000030;
  Compilation *comp;
  Expression *in_stack_00000070;
  ASTContext *in_stack_00000078;
  undefined8 in_stack_fffffffffffffff8;
  undefined1 isMethod;
  
  isMethod = (undefined1)((ulong)in_stack_fffffffffffffff8 >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0x93d1f6);
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_00000008,unaff_retaddr,(bool)isMethod,in_R8,
                     (SourceRange)in_stack_00000010,in_stack_00000030,(size_t)comp);
  if (bVar1) {
    sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x93d261
                      );
    if (sVar3 == 1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      bVar1 = FmtHelpers::checkFinishNum(in_stack_00000078,in_stack_00000070);
      if (!bVar1) {
        pTVar2 = Compilation::getErrorType(this_00);
        return pTVar2;
      }
    }
    pTVar2 = Compilation::getVoidType(this_00);
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, 1))
            return comp.getErrorType();

        if (args.size() == 1) {
            if (!FmtHelpers::checkFinishNum(context, *args[0]))
                return comp.getErrorType();
        }

        return comp.getVoidType();
    }